

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

void Ifn_NtkMatchPrintConfig(Ifn_Ntk_t *p,sat_solver *pSat)

{
  int iVar1;
  Ifn_Obj_t *pIVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)p->nObjs;
  if (p->nObjs < p->nPars) {
    do {
      iVar1 = p->nInps;
      iVar3 = (int)uVar4;
      if (iVar1 < p->nObjs) {
        pIVar2 = p->Nodes + iVar1;
        iVar1 = p->nObjs - iVar1;
        do {
          if (((*(uint *)pIVar2 & 7) == 6) && (uVar4 == (*(uint *)pIVar2 >> 8 & 0xff))) {
            putchar(0x20);
            goto LAB_0043ed97;
          }
          pIVar2 = pIVar2 + 1;
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
      }
      iVar1 = iVar3 - p->nParsVIni;
      if ((p->nParsVIni <= iVar3) && (iVar1 % p->nParsVNum == 0)) {
        printf(" %d=",(long)iVar1 / (long)p->nParsVNum & 0xffffffff);
      }
      if (iVar3 < 0) {
LAB_0043ede5:
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
LAB_0043ed97:
      if (pSat->size <= iVar3) goto LAB_0043ede5;
      printf("%d",(ulong)(pSat->model[uVar4] == 1));
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < p->nPars);
  }
  return;
}

Assistant:

void Ifn_NtkMatchPrintConfig( Ifn_Ntk_t * p, sat_solver * pSat )
{
    int v, i;
    for ( v = p->nObjs; v < p->nPars; v++ )
    {
        for ( i = p->nInps; i < p->nObjs; i++ )
            if ( p->Nodes[i].Type == IFN_DSD_PRIME && (int)p->Nodes[i].iFirst == v )
                break;
        if ( i < p->nObjs )
            printf( " " );
        else if ( v >= p->nParsVIni && (v - p->nParsVIni) % p->nParsVNum == 0 )
            printf( " %d=", (v - p->nParsVIni) / p->nParsVNum );
        printf( "%d", sat_solver_var_value(pSat, v) );
    }
}